

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O0

void __thiscall
celero::Experiment::addProblemSpace
          (Experiment *this,shared_ptr<celero::TestFixture::ExperimentValue> *x,double scale)

{
  element_type *this_00;
  Impl *this_01;
  shared_ptr<celero::TestFixture::ExperimentValue> local_48;
  Experiment *local_38;
  undefined1 local_30 [8];
  shared_ptr<celero::ExperimentResult> r;
  double scale_local;
  shared_ptr<celero::TestFixture::ExperimentValue> *x_local;
  Experiment *this_local;
  
  local_38 = this;
  r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)scale;
  std::make_shared<celero::ExperimentResult,celero::Experiment*>((Experiment **)local_30);
  this_00 = std::
            __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
  std::shared_ptr<celero::TestFixture::ExperimentValue>::shared_ptr(&local_48,x);
  ExperimentResult::setProblemSpaceValue
            (this_00,&local_48,
             (double)r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  std::shared_ptr<celero::TestFixture::ExperimentValue>::~shared_ptr(&local_48);
  this_01 = Pimpl<celero::Experiment::Impl>::operator->(&this->pimpl);
  std::
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  ::push_back(&this_01->results,(value_type *)local_30);
  std::shared_ptr<celero::ExperimentResult>::~shared_ptr
            ((shared_ptr<celero::ExperimentResult> *)local_30);
  return;
}

Assistant:

void Experiment::addProblemSpace(std::shared_ptr<celero::TestFixture::ExperimentValue> x, double scale)
{
	auto r = std::make_shared<celero::ExperimentResult>(this);
	r->setProblemSpaceValue(x, scale);
	this->pimpl->results.push_back(r);
}